

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_sqlite.cpp
# Opt level: O2

bool __thiscall QSQLiteResult::prepare(QSQLiteResult *this,QString *query)

{
  QSQLiteResultPrivate *this_00;
  sqlite3 *psVar1;
  qsizetype qVar2;
  char cVar3;
  int iVar4;
  long lVar5;
  long *plVar6;
  QSQLiteDriverPrivate *pQVar7;
  bool bVar8;
  EVP_PKEY_CTX *ctx;
  char16_t *zSql;
  long in_FS_OFFSET;
  undefined1 local_70 [40];
  long local_48;
  void *pzTail;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QSQLiteResultPrivate **)&this->field_0x8;
  ctx = (EVP_PKEY_CTX *)query;
  lVar5 = QSqlResult::driver();
  if (lVar5 != 0) {
    plVar6 = (long *)QSqlResult::driver();
    cVar3 = (**(code **)(*plVar6 + 0x60))(plVar6);
    if (cVar3 != '\0') {
      QSqlResult::driver();
      cVar3 = QSqlDriver::isOpenError();
      if (cVar3 == '\0') {
        QSQLiteResultPrivate::cleanup(this_00,ctx);
        (**(code **)(*(long *)this + 0x38))(this,0);
        pzTail = (void *)0x0;
        qVar2 = (query->d).size;
        pQVar7 = QSQLiteResultPrivate::drv_d_func(this_00);
        zSql = (query->d).ptr;
        if (zSql == (char16_t *)0x0) {
          zSql = (char16_t *)&QString::_empty;
        }
        iVar4 = sqlite3_prepare16_v2(pQVar7->access,zSql,(int)qVar2 * 2 + 2,&this_00->stmt,&pzTail);
        if (iVar4 == 0) {
          bVar8 = true;
          if (pzTail == (void *)0x0) goto LAB_00112af0;
          QString::QString((QString *)local_70,(QChar *)pzTail,-1);
          QString::trimmed_helper((QString *)(local_70 + 0x18));
          QArrayDataPointer<char16_t>::~QArrayDataPointer
                    ((QArrayDataPointer<char16_t> *)(local_70 + 0x18));
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_70);
          if (local_48 == 0) goto LAB_00112af0;
          pQVar7 = QSQLiteResultPrivate::drv_d_func(this_00);
          psVar1 = pQVar7->access;
          QCoreApplication::translate
                    (local_70 + 0x18,"QSQLiteResult",
                     "Unable to execute multiple statements at a time",0);
          qMakeError((sqlite3 *)local_70,(QString *)psVar1,(ErrorType)(local_70 + 0x18),2);
          (**(code **)(*(long *)this + 0x28))(this,(sqlite3 *)local_70);
          QSqlError::~QSqlError((QSqlError *)local_70);
        }
        else {
          pQVar7 = QSQLiteResultPrivate::drv_d_func(this_00);
          psVar1 = pQVar7->access;
          QCoreApplication::translate
                    (local_70 + 0x18,"QSQLiteResult","Unable to execute statement",0);
          qMakeError((sqlite3 *)local_70,(QString *)psVar1,(ErrorType)(local_70 + 0x18),2);
          (**(code **)(*(long *)this + 0x28))(this,(sqlite3 *)local_70);
          QSqlError::~QSqlError((QSqlError *)local_70);
        }
        QArrayDataPointer<char16_t>::~QArrayDataPointer
                  ((QArrayDataPointer<char16_t> *)(local_70 + 0x18));
        QSQLiteResultPrivate::finalize(this_00);
      }
    }
  }
  bVar8 = false;
LAB_00112af0:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar8;
  }
  __stack_chk_fail();
}

Assistant:

bool QSQLiteResult::prepare(const QString &query)
{
    Q_D(QSQLiteResult);
    if (!driver() || !driver()->isOpen() || driver()->isOpenError())
        return false;

    d->cleanup();

    setSelect(false);

    const void *pzTail = nullptr;
    const auto size = int((query.size() + 1) * sizeof(QChar));

#if (SQLITE_VERSION_NUMBER >= 3003011)
    int res = sqlite3_prepare16_v2(d->drv_d_func()->access, query.constData(), size,
                                   &d->stmt, &pzTail);
#else
    int res = sqlite3_prepare16(d->access, query.constData(), size,
                                &d->stmt, &pzTail);
#endif

    if (res != SQLITE_OK) {
        setLastError(qMakeError(d->drv_d_func()->access, QCoreApplication::translate("QSQLiteResult",
                     "Unable to execute statement"), QSqlError::StatementError, res));
        d->finalize();
        return false;
    } else if (pzTail && !QString(reinterpret_cast<const QChar *>(pzTail)).trimmed().isEmpty()) {
        setLastError(qMakeError(d->drv_d_func()->access, QCoreApplication::translate("QSQLiteResult",
            "Unable to execute multiple statements at a time"), QSqlError::StatementError, SQLITE_MISUSE));
        d->finalize();
        return false;
    }
    return true;
}